

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_indexer.hpp
# Opt level: O1

void set_reference_points<float,int>
               (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,TreesIndexer *indexer,
               bool with_distances,float *numeric_data,int *categ_data,bool is_col_major,
               size_t ld_numeric,size_t ld_categ,float *Xc,int *Xc_ind,int *Xc_indptr,float *Xr,
               int *Xr_ind,int *Xr_indptr,size_t nrows,int nthreads)

{
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range2;
  
  if (model_outputs == (IsoForest *)0x0) {
    set_reference_points<ExtIsoForest,float,int>
              (indexer,model_outputs_ext,with_distances,numeric_data,categ_data,is_col_major,
               ld_numeric,ld_categ,Xc,Xc_ind,Xc_indptr,Xr,Xr_ind,Xr_indptr,nrows,nthreads);
  }
  else {
    set_reference_points<IsoForest,float,int>
              (indexer,model_outputs,with_distances,numeric_data,categ_data,is_col_major,ld_numeric,
               ld_categ,Xc,Xc_ind,Xc_indptr,Xr,Xr_ind,Xr_indptr,nrows,nthreads);
  }
  return;
}

Assistant:

void set_reference_points(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext, TreesIndexer *indexer,
                          const bool with_distances,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                          size_t nrows, int nthreads)
{
    try
    {
        if (model_outputs != NULL)
            set_reference_points(*indexer, *model_outputs, with_distances,
                                 numeric_data, categ_data,
                                 is_col_major, ld_numeric, ld_categ,
                                 Xc, Xc_ind, Xc_indptr,
                                 Xr, Xr_ind, Xr_indptr,
                                 nrows, nthreads);
        else
            set_reference_points(*indexer, *model_outputs_ext, with_distances,
                                 numeric_data, categ_data,
                                 is_col_major, ld_numeric, ld_categ,
                                 Xc, Xc_ind, Xc_indptr,
                                 Xr, Xr_ind, Xr_indptr,
                                 nrows, nthreads);
    }

    catch (...)
    {
        for (auto &tree : indexer->indices)
        {
            tree.reference_points.clear();
            tree.reference_indptr.clear();
            tree.reference_mapping.clear();
        }

        throw;
    }
}